

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::BasicReporter::NoAssertionsInSection(BasicReporter *this,string *sectionName)

{
  ostream *poVar1;
  
  startSpansLazily(this);
  poVar1 = (this->m_config).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nNo assertions in section, \'",0x1c);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(sectionName->_M_dataplus)._M_p,sectionName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

virtual void NoAssertionsInSection( const std::string& sectionName ) {
            startSpansLazily();
            TextColour colour( TextColour::ResultError );
            m_config.stream << "\nNo assertions in section, '" << sectionName << "'\n" << std::endl;
        }